

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore_posix.cpp
# Opt level: O1

void __thiscall
QSystemSemaphorePosix::cleanHandle(QSystemSemaphorePosix *this,QSystemSemaphorePrivate *self)

{
  QArrayData *data;
  QChar *data_00;
  qsizetype size;
  int iVar1;
  int *piVar2;
  char *__name;
  long in_FS_OFFSET;
  QLatin1StringView function;
  QLatin1StringView function_00;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((sem_t *)this->semaphore != (sem_t *)0x0) {
    iVar1 = sem_close((sem_t *)this->semaphore);
    if (iVar1 == -1) {
      function.m_data = "QSystemSemaphore::cleanHandle (sem_close)";
      function.m_size = 0x29;
      QSystemSemaphorePrivate::setUnixErrorString(self,function);
    }
    this->semaphore = (sem_t *)0x0;
  }
  if (this->createdSemaphore == true) {
    local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    data = &((self->nativeKey).key.d.d)->super_QArrayData;
    data_00 = (QChar *)(self->nativeKey).key.d.ptr;
    size = (self->nativeKey).key.d.size;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::toLocal8Bit_helper(&local_38,data_00,size);
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
    __name = local_38.d.ptr;
    if (local_38.d.ptr == (char *)0x0) {
      __name = "";
    }
    iVar1 = sem_unlink(__name);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 2) {
        function_00.m_data = "QSystemSemaphore::cleanHandle (sem_unlink)";
        function_00.m_size = 0x2a;
        QSystemSemaphorePrivate::setUnixErrorString(self,function_00);
      }
    }
    this->createdSemaphore = false;
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSystemSemaphorePosix::cleanHandle(QSystemSemaphorePrivate *self)
{
    if (semaphore != SEM_FAILED) {
        if (::sem_close(semaphore) == -1) {
            self->setUnixErrorString("QSystemSemaphore::cleanHandle (sem_close)"_L1);
#if defined QSYSTEMSEMAPHORE_DEBUG
            qDebug("QSystemSemaphore::cleanHandle sem_close failed.");
#endif
        }
        semaphore = SEM_FAILED;
    }

    if (createdSemaphore) {
        const QByteArray semName = QFile::encodeName(self->nativeKey.nativeKey());
        if (::sem_unlink(semName) == -1 && errno != ENOENT) {
            self->setUnixErrorString("QSystemSemaphore::cleanHandle (sem_unlink)"_L1);
#if defined QSYSTEMSEMAPHORE_DEBUG
            qDebug("QSystemSemaphorePosix::cleanHandle sem_unlink failed.");
#endif
        }
        createdSemaphore = false;
    }
}